

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O0

void __thiscall
t_go_generator::generate_go_struct_reader
          (t_go_generator *this,ostream *out,t_struct *tstruct,string *tstruct_name,bool is_result)

{
  t_field *tfield;
  bool bVar1;
  byte bVar2;
  int iVar3;
  int32_t iVar4;
  e_req eVar5;
  members_type *this_00;
  undefined4 extraout_var;
  ostream *poVar6;
  reference pptVar7;
  t_type *ptVar8;
  undefined4 extraout_var_00;
  string *psVar9;
  string local_778;
  string local_758;
  allocator local_731;
  string local_730;
  string local_710;
  int local_6ec;
  int32_t local_6e8;
  int32_t field_method_suffix_1;
  int32_t field_id_1;
  string field_method_prefix_1;
  string field_name_3;
  string field_type_name;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  undefined1 local_5b0 [8];
  string field_name_2;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  undefined1 local_320 [8];
  string field_name_1;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  int local_240;
  allocator local_239;
  int32_t field_method_suffix;
  string field_method_prefix;
  undefined1 local_200 [3];
  bool have_switch;
  int32_t field_id;
  string thriftFieldTypeId;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  undefined1 local_120 [8];
  string field_name;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_80;
  string local_60 [8];
  string escaped_tstruct_name;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  bool is_result_local;
  string *tstruct_name_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_go_generator *this_local;
  
  this_00 = t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     *)((long)&escaped_tstruct_name.field_2 + 8));
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  (*(this->super_t_generator)._vptr_t_generator[3])(local_60,this,CONCAT44(extraout_var,iVar3));
  t_generator::indent_abi_cxx11_(&local_80,&this->super_t_generator);
  poVar6 = std::operator<<(out,(string *)&local_80);
  poVar6 = std::operator<<(poVar6,"func (p *");
  poVar6 = std::operator<<(poVar6,(string *)tstruct_name);
  poVar6 = std::operator<<(poVar6,") ");
  poVar6 = std::operator<<(poVar6,(string *)&this->read_method_name_);
  poVar6 = std::operator<<(poVar6,"(ctx context.Context, iprot thrift.TProtocol) error {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_80);
  t_generator::indent_up(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_b0,&this->super_t_generator);
  poVar6 = std::operator<<(out,(string *)&local_b0);
  poVar6 = std::operator<<(poVar6,"if _, err := iprot.ReadStructBegin(ctx); err != nil {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_b0);
  t_generator::indent_abi_cxx11_(&local_d0,&this->super_t_generator);
  poVar6 = std::operator<<(out,(string *)&local_d0);
  poVar6 = std::operator<<(poVar6,
                           "  return thrift.PrependError(fmt.Sprintf(\"%T read error: \", p), err)")
  ;
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_d0);
  t_generator::indent_abi_cxx11_(&local_f0,&this->super_t_generator);
  poVar6 = std::operator<<(out,(string *)&local_f0);
  poVar6 = std::operator<<(poVar6,"}");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_f0);
  escaped_tstruct_name.field_2._8_8_ =
       std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
  while( true ) {
    field_name.field_2._8_8_ = std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)((long)&escaped_tstruct_name.field_2 + 8),
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)((long)&field_name.field_2 + 8));
    if (!bVar1) break;
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&escaped_tstruct_name.field_2 + 8));
    eVar5 = t_field::get_req(*pptVar7);
    if (eVar5 == T_REQUIRED) {
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&escaped_tstruct_name.field_2 + 8));
      psVar9 = t_field::get_name_abi_cxx11_(*pptVar7);
      (*(this->super_t_generator)._vptr_t_generator[3])(&local_140,this,psVar9);
      publicize((string *)local_120,this,&local_140,false);
      std::__cxx11::string::~string((string *)&local_140);
      poVar6 = t_generator::indent(&this->super_t_generator,out);
      poVar6 = std::operator<<(poVar6,"var isset");
      poVar6 = std::operator<<(poVar6,(string *)local_120);
      poVar6 = std::operator<<(poVar6," bool = false;");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)local_120);
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                *)((long)&escaped_tstruct_name.field_2 + 8));
  }
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  poVar6 = t_generator::indent(&this->super_t_generator,out);
  poVar6 = std::operator<<(poVar6,"for {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_160,&this->super_t_generator);
  poVar6 = std::operator<<(out,(string *)&local_160);
  poVar6 = std::operator<<(poVar6,"_, fieldTypeId, fieldId, err := iprot.ReadFieldBegin(ctx)");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_160);
  t_generator::indent_abi_cxx11_(&local_180,&this->super_t_generator);
  poVar6 = std::operator<<(out,(string *)&local_180);
  poVar6 = std::operator<<(poVar6,"if err != nil {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_180);
  t_generator::indent_abi_cxx11_(&local_1a0,&this->super_t_generator);
  poVar6 = std::operator<<(out,(string *)&local_1a0);
  poVar6 = std::operator<<(poVar6,
                           "  return thrift.PrependError(fmt.Sprintf(\"%T field %d read error: \", p, fieldId), err)"
                          );
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1a0);
  t_generator::indent_abi_cxx11_(&local_1c0,&this->super_t_generator);
  poVar6 = std::operator<<(out,(string *)&local_1c0);
  poVar6 = std::operator<<(poVar6,"}");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1c0);
  t_generator::indent_abi_cxx11_
            ((string *)((long)&thriftFieldTypeId.field_2 + 8),&this->super_t_generator);
  poVar6 = std::operator<<(out,(string *)(thriftFieldTypeId.field_2._M_local_buf + 8));
  poVar6 = std::operator<<(poVar6,"if fieldTypeId == thrift.STOP { break; }");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)(thriftFieldTypeId.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_200);
  bVar1 = std::vector<t_field_*,_std::allocator<t_field_*>_>::empty(this_00);
  bVar2 = (bVar1 ^ 0xffU) & 1;
  if (bVar2 != 0) {
    poVar6 = t_generator::indent(&this->super_t_generator,out);
    poVar6 = std::operator<<(poVar6,"switch fieldId {");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  }
  escaped_tstruct_name.field_2._8_8_ =
       std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
  while( true ) {
    field_method_prefix.field_2._8_8_ =
         std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)((long)&escaped_tstruct_name.field_2 + 8),
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)((long)&field_method_prefix.field_2 + 8));
    if (!bVar1) break;
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&escaped_tstruct_name.field_2 + 8));
    iVar4 = t_field::get_key(*pptVar7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&field_method_suffix,"ReadField",&local_239);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    local_240 = iVar4;
    if (iVar4 < 0) {
      std::__cxx11::string::operator+=((string *)&field_method_suffix,"_");
      local_240 = -local_240;
    }
    t_generator::indent_abi_cxx11_(&local_260,&this->super_t_generator);
    poVar6 = std::operator<<(out,(string *)&local_260);
    poVar6 = std::operator<<(poVar6,"case ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
    poVar6 = std::operator<<(poVar6,":");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_260);
    t_generator::indent_up(&this->super_t_generator);
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&escaped_tstruct_name.field_2 + 8));
    ptVar8 = t_field::get_type(*pptVar7);
    type_to_enum_abi_cxx11_(&local_280,this,ptVar8);
    std::__cxx11::string::operator=((string *)local_200,(string *)&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_200,"thrift.BINARY");
    if (bVar1) {
      std::__cxx11::string::operator=((string *)local_200,"thrift.STRING");
    }
    t_generator::indent_abi_cxx11_(&local_2a0,&this->super_t_generator);
    poVar6 = std::operator<<(out,(string *)&local_2a0);
    poVar6 = std::operator<<(poVar6,"if fieldTypeId == ");
    poVar6 = std::operator<<(poVar6,(string *)local_200);
    poVar6 = std::operator<<(poVar6," {");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2a0);
    t_generator::indent_abi_cxx11_(&local_2c0,&this->super_t_generator);
    poVar6 = std::operator<<(out,(string *)&local_2c0);
    poVar6 = std::operator<<(poVar6,"  if err := p.");
    poVar6 = std::operator<<(poVar6,(string *)&field_method_suffix);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_240);
    poVar6 = std::operator<<(poVar6,"(ctx, iprot); err != nil {");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2c0);
    t_generator::indent_abi_cxx11_(&local_2e0,&this->super_t_generator);
    poVar6 = std::operator<<(out,(string *)&local_2e0);
    poVar6 = std::operator<<(poVar6,"    return err");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2e0);
    t_generator::indent_abi_cxx11_
              ((string *)((long)&field_name_1.field_2 + 8),&this->super_t_generator);
    poVar6 = std::operator<<(out,(string *)(field_name_1.field_2._M_local_buf + 8));
    poVar6 = std::operator<<(poVar6,"  }");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)(field_name_1.field_2._M_local_buf + 8));
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&escaped_tstruct_name.field_2 + 8));
    eVar5 = t_field::get_req(*pptVar7);
    if (eVar5 == T_REQUIRED) {
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&escaped_tstruct_name.field_2 + 8));
      psVar9 = t_field::get_name_abi_cxx11_(*pptVar7);
      (*(this->super_t_generator)._vptr_t_generator[3])(&local_340,this,psVar9);
      publicize((string *)local_320,this,&local_340,false);
      std::__cxx11::string::~string((string *)&local_340);
      t_generator::indent_abi_cxx11_(&local_360,&this->super_t_generator);
      poVar6 = std::operator<<(out,(string *)&local_360);
      poVar6 = std::operator<<(poVar6,"  isset");
      poVar6 = std::operator<<(poVar6,(string *)local_320);
      poVar6 = std::operator<<(poVar6," = true");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::string::~string((string *)local_320);
    }
    t_generator::indent_abi_cxx11_(&local_380,&this->super_t_generator);
    poVar6 = std::operator<<(out,(string *)&local_380);
    poVar6 = std::operator<<(poVar6,"} else {");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_380);
    t_generator::indent_abi_cxx11_(&local_3a0,&this->super_t_generator);
    poVar6 = std::operator<<(out,(string *)&local_3a0);
    poVar6 = std::operator<<(poVar6,"  if err := iprot.Skip(ctx, fieldTypeId); err != nil {");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_3a0);
    t_generator::indent_abi_cxx11_(&local_3c0,&this->super_t_generator);
    poVar6 = std::operator<<(out,(string *)&local_3c0);
    poVar6 = std::operator<<(poVar6,"    return err");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_3c0);
    t_generator::indent_abi_cxx11_(&local_3e0,&this->super_t_generator);
    poVar6 = std::operator<<(out,(string *)&local_3e0);
    poVar6 = std::operator<<(poVar6,"  }");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_3e0);
    t_generator::indent_abi_cxx11_(&local_400,&this->super_t_generator);
    poVar6 = std::operator<<(out,(string *)&local_400);
    poVar6 = std::operator<<(poVar6,"}");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_400);
    t_generator::indent_down(&this->super_t_generator);
    std::__cxx11::string::~string((string *)&field_method_suffix);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                *)((long)&escaped_tstruct_name.field_2 + 8));
  }
  if (bVar2 != 0) {
    t_generator::indent_abi_cxx11_(&local_420,&this->super_t_generator);
    poVar6 = std::operator<<(out,(string *)&local_420);
    poVar6 = std::operator<<(poVar6,"default:");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_420);
    t_generator::indent_up(&this->super_t_generator);
  }
  t_generator::indent_abi_cxx11_(&local_440,&this->super_t_generator);
  poVar6 = std::operator<<(out,(string *)&local_440);
  poVar6 = std::operator<<(poVar6,"if err := iprot.Skip(ctx, fieldTypeId); err != nil {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_440);
  t_generator::indent_abi_cxx11_(&local_460,&this->super_t_generator);
  poVar6 = std::operator<<(out,(string *)&local_460);
  poVar6 = std::operator<<(poVar6,"  return err");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_460);
  t_generator::indent_abi_cxx11_(&local_480,&this->super_t_generator);
  poVar6 = std::operator<<(out,(string *)&local_480);
  poVar6 = std::operator<<(poVar6,"}");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_480);
  if (bVar2 != 0) {
    t_generator::indent_down(&this->super_t_generator);
    t_generator::indent_abi_cxx11_(&local_4a0,&this->super_t_generator);
    poVar6 = std::operator<<(out,(string *)&local_4a0);
    poVar6 = std::operator<<(poVar6,"}");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_4a0);
  }
  t_generator::indent_abi_cxx11_(&local_4c0,&this->super_t_generator);
  poVar6 = std::operator<<(out,(string *)&local_4c0);
  poVar6 = std::operator<<(poVar6,"if err := iprot.ReadFieldEnd(ctx); err != nil {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_4c0);
  t_generator::indent_abi_cxx11_(&local_4e0,&this->super_t_generator);
  poVar6 = std::operator<<(out,(string *)&local_4e0);
  poVar6 = std::operator<<(poVar6,"  return err");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_4e0);
  t_generator::indent_abi_cxx11_(&local_500,&this->super_t_generator);
  poVar6 = std::operator<<(out,(string *)&local_500);
  poVar6 = std::operator<<(poVar6,"}");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_500);
  t_generator::indent_down(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_520,&this->super_t_generator);
  poVar6 = std::operator<<(out,(string *)&local_520);
  poVar6 = std::operator<<(poVar6,"}");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_520);
  t_generator::indent_abi_cxx11_(&local_540,&this->super_t_generator);
  poVar6 = std::operator<<(out,(string *)&local_540);
  poVar6 = std::operator<<(poVar6,"if err := iprot.ReadStructEnd(ctx); err != nil {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_540);
  t_generator::indent_abi_cxx11_(&local_560,&this->super_t_generator);
  poVar6 = std::operator<<(out,(string *)&local_560);
  poVar6 = std::operator<<(poVar6,
                           "  return thrift.PrependError(fmt.Sprintf(\"%T read struct end error: \", p), err)"
                          );
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_560);
  t_generator::indent_abi_cxx11_(&local_580,&this->super_t_generator);
  poVar6 = std::operator<<(out,(string *)&local_580);
  poVar6 = std::operator<<(poVar6,"}");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_580);
  escaped_tstruct_name.field_2._8_8_ =
       std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
  while( true ) {
    field_name_2.field_2._8_8_ = std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)((long)&escaped_tstruct_name.field_2 + 8),
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)((long)&field_name_2.field_2 + 8));
    if (!bVar1) break;
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&escaped_tstruct_name.field_2 + 8));
    eVar5 = t_field::get_req(*pptVar7);
    if (eVar5 == T_REQUIRED) {
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&escaped_tstruct_name.field_2 + 8));
      psVar9 = t_field::get_name_abi_cxx11_(*pptVar7);
      (*(this->super_t_generator)._vptr_t_generator[3])(&local_5d0,this,psVar9);
      publicize((string *)local_5b0,this,&local_5d0,false);
      std::__cxx11::string::~string((string *)&local_5d0);
      t_generator::indent_abi_cxx11_(&local_5f0,&this->super_t_generator);
      poVar6 = std::operator<<(out,(string *)&local_5f0);
      poVar6 = std::operator<<(poVar6,"if !isset");
      poVar6 = std::operator<<(poVar6,(string *)local_5b0);
      poVar6 = std::operator<<(poVar6,"{");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_5f0);
      t_generator::indent_abi_cxx11_(&local_610,&this->super_t_generator);
      poVar6 = std::operator<<(out,(string *)&local_610);
      poVar6 = std::operator<<(poVar6,
                               "  return thrift.NewTProtocolExceptionWithType(thrift.INVALID_DATA, fmt.Errorf(\"Required field "
                              );
      poVar6 = std::operator<<(poVar6,(string *)local_5b0);
      poVar6 = std::operator<<(poVar6," is not set\"));");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_610);
      t_generator::indent_abi_cxx11_(&local_630,&this->super_t_generator);
      poVar6 = std::operator<<(out,(string *)&local_630);
      poVar6 = std::operator<<(poVar6,"}");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_630);
      std::__cxx11::string::~string((string *)local_5b0);
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                *)((long)&escaped_tstruct_name.field_2 + 8));
  }
  t_generator::indent_abi_cxx11_(&local_650,&this->super_t_generator);
  poVar6 = std::operator<<(out,(string *)&local_650);
  poVar6 = std::operator<<(poVar6,"return nil");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_650);
  t_generator::indent_down(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_670,&this->super_t_generator);
  poVar6 = std::operator<<(out,(string *)&local_670);
  poVar6 = std::operator<<(poVar6,"}");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_670);
  escaped_tstruct_name.field_2._8_8_ =
       std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
  while( true ) {
    field_type_name.field_2._8_8_ = std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00)
    ;
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)((long)&escaped_tstruct_name.field_2 + 8),
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)((long)&field_type_name.field_2 + 8));
    if (!bVar1) break;
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&escaped_tstruct_name.field_2 + 8));
    ptVar8 = t_field::get_type(*pptVar7);
    iVar3 = (*(ptVar8->super_t_doc)._vptr_t_doc[3])();
    publicize((string *)((long)&field_name_3.field_2 + 8),this,
              (string *)CONCAT44(extraout_var_00,iVar3),false);
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&escaped_tstruct_name.field_2 + 8));
    psVar9 = t_field::get_name_abi_cxx11_(*pptVar7);
    publicize((string *)((long)&field_method_prefix_1.field_2 + 8),this,psVar9,false);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&field_id_1,"ReadField",(allocator *)((long)&field_method_suffix_1 + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)&field_method_suffix_1 + 3));
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&escaped_tstruct_name.field_2 + 8));
    local_6ec = t_field::get_key(*pptVar7);
    local_6e8 = local_6ec;
    if (local_6ec < 0) {
      std::__cxx11::string::operator+=((string *)&field_id_1,"_");
      local_6ec = -local_6ec;
    }
    t_generator::indent_abi_cxx11_(&local_710,&this->super_t_generator);
    poVar6 = std::operator<<(out,(string *)&local_710);
    poVar6 = std::operator<<(poVar6,"func (p *");
    poVar6 = std::operator<<(poVar6,(string *)tstruct_name);
    poVar6 = std::operator<<(poVar6,")  ");
    poVar6 = std::operator<<(poVar6,(string *)&field_id_1);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_6ec);
    poVar6 = std::operator<<(poVar6,"(ctx context.Context, iprot thrift.TProtocol) error {");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_710);
    t_generator::indent_up(&this->super_t_generator);
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&escaped_tstruct_name.field_2 + 8));
    tfield = *pptVar7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_730,"p.",&local_731);
    generate_deserialize_field(this,out,tfield,false,&local_730,false,false,false,false);
    std::__cxx11::string::~string((string *)&local_730);
    std::allocator<char>::~allocator((allocator<char> *)&local_731);
    t_generator::indent_down(&this->super_t_generator);
    t_generator::indent_abi_cxx11_(&local_758,&this->super_t_generator);
    poVar6 = std::operator<<(out,(string *)&local_758);
    poVar6 = std::operator<<(poVar6,"  return nil");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_758);
    t_generator::indent_abi_cxx11_(&local_778,&this->super_t_generator);
    poVar6 = std::operator<<(out,(string *)&local_778);
    poVar6 = std::operator<<(poVar6,"}");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_778);
    std::__cxx11::string::~string((string *)&field_id_1);
    std::__cxx11::string::~string((string *)(field_method_prefix_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(field_name_3.field_2._M_local_buf + 8));
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                *)((long)&escaped_tstruct_name.field_2 + 8));
  }
  std::__cxx11::string::~string((string *)local_200);
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

void t_go_generator::generate_go_struct_reader(ostream& out,
                                               t_struct* tstruct,
                                               const string& tstruct_name,
                                               bool is_result) {
  (void)is_result;
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;
  string escaped_tstruct_name(escape_string(tstruct->get_name()));
  out << indent() << "func (p *" << tstruct_name << ") " << read_method_name_ << "(ctx context.Context, iprot thrift.TProtocol) error {"
      << endl;
  indent_up();
  out << indent() << "if _, err := iprot.ReadStructBegin(ctx); err != nil {" << endl;
  out << indent() << "  return thrift.PrependError(fmt.Sprintf(\"%T read error: \", p), err)"
      << endl;
  out << indent() << "}" << endl << endl;

  // Required variables does not have IsSet functions, so we need tmp vars to check them.
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      const string field_name(publicize(escape_string((*f_iter)->get_name())));
      indent(out) << "var isset" << field_name << " bool = false;" << endl;
    }
  }
  out << endl;

  // Loop over reading in fields
  indent(out) << "for {" << endl;
  indent_up();
  // Read beginning field marker
  out << indent() << "_, fieldTypeId, fieldId, err := iprot.ReadFieldBegin(ctx)" << endl;
  out << indent() << "if err != nil {" << endl;
  out << indent() << "  return thrift.PrependError(fmt.Sprintf("
                     "\"%T field %d read error: \", p, fieldId), err)" << endl;
  out << indent() << "}" << endl;
  // Check for field STOP marker and break
  out << indent() << "if fieldTypeId == thrift.STOP { break; }" << endl;

  string thriftFieldTypeId;
  // Generate deserialization code for known cases
  int32_t field_id = -1;

  // Switch statement on the field we are reading, false if no fields present
  bool have_switch = !fields.empty();
  if (have_switch) {
    indent(out) << "switch fieldId {" << endl;
  }

  // All the fields we know
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    field_id = (*f_iter)->get_key();

    // if negative id, ensure we generate a valid method name
    string field_method_prefix("ReadField");
    int32_t field_method_suffix = field_id;

    if (field_method_suffix < 0) {
      field_method_prefix += "_";
      field_method_suffix *= -1;
    }

    out << indent() << "case " << field_id << ":" << endl;
    indent_up();
    thriftFieldTypeId = type_to_enum((*f_iter)->get_type());

    if (thriftFieldTypeId == "thrift.BINARY") {
      thriftFieldTypeId = "thrift.STRING";
    }

    out << indent() << "if fieldTypeId == " << thriftFieldTypeId << " {" << endl;
    out << indent() << "  if err := p." << field_method_prefix << field_method_suffix << "(ctx, iprot); err != nil {"
        << endl;
    out << indent() << "    return err" << endl;
    out << indent() << "  }" << endl;

    // Mark required field as read
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      const string field_name(publicize(escape_string((*f_iter)->get_name())));
      out << indent() << "  isset" << field_name << " = true" << endl;
    }

    out << indent() << "} else {" << endl;
    out << indent() << "  if err := iprot.Skip(ctx, fieldTypeId); err != nil {" << endl;
    out << indent() << "    return err" << endl;
    out << indent() << "  }" << endl;
    out << indent() << "}" << endl;


    indent_down();
  }

  // Begin switch default case
  if (have_switch) {
    out << indent() << "default:" << endl;
    indent_up();
  }

  // Skip unknown fields in either case
  out << indent() << "if err := iprot.Skip(ctx, fieldTypeId); err != nil {" << endl;
  out << indent() << "  return err" << endl;
  out << indent() << "}" << endl;

  // End switch default case
  if (have_switch) {
    indent_down();
    out << indent() << "}" << endl;
  }

  // Read field end marker
  out << indent() << "if err := iprot.ReadFieldEnd(ctx); err != nil {" << endl;
  out << indent() << "  return err" << endl;
  out << indent() << "}" << endl;
  indent_down();
  out << indent() << "}" << endl;
  out << indent() << "if err := iprot.ReadStructEnd(ctx); err != nil {" << endl;
  out << indent() << "  return thrift.PrependError(fmt.Sprintf("
                     "\"%T read struct end error: \", p), err)" << endl;
  out << indent() << "}" << endl;

  // Return error if any required fields are missing.
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      const string field_name(publicize(escape_string((*f_iter)->get_name())));
      out << indent() << "if !isset" << field_name << "{" << endl;
      out << indent() << "  return thrift.NewTProtocolExceptionWithType(thrift.INVALID_DATA, "
                         "fmt.Errorf(\"Required field " << field_name << " is not set\"));" << endl;
      out << indent() << "}" << endl;
    }
  }

  out << indent() << "return nil" << endl;
  indent_down();
  out << indent() << "}" << endl << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    string field_type_name(publicize((*f_iter)->get_type()->get_name()));
    string field_name(publicize((*f_iter)->get_name()));
    string field_method_prefix("ReadField");
    int32_t field_id = (*f_iter)->get_key();
    int32_t field_method_suffix = field_id;

    if (field_method_suffix < 0) {
      field_method_prefix += "_";
      field_method_suffix *= -1;
    }

    out << indent() << "func (p *" << tstruct_name << ")  " << field_method_prefix << field_method_suffix
        << "(ctx context.Context, iprot thrift.TProtocol) error {" << endl;
    indent_up();
    generate_deserialize_field(out, *f_iter, false, "p.");
    indent_down();
    out << indent() << "  return nil" << endl;
    out << indent() << "}" << endl << endl;
  }
}